

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O2

void __thiscall
icu_63::UTF8CollationIterator::forwardNumCodePoints
          (UTF8CollationIterator *this,int32_t num,UErrorCode *param_2)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint8_t *puVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar3 = this->length;
  puVar4 = this->u8;
  iVar6 = this->pos;
  do {
    if ((num < 1) ||
       ((lVar7 = (long)iVar6, (int)uVar3 <= iVar6 && ((-1 < (int)uVar3 || (puVar4[lVar7] == '\0'))))
       )) {
      return;
    }
    uVar8 = lVar7 + 1;
    this->pos = (uint)uVar8;
    bVar1 = puVar4[lVar7];
    if ((0xcc < (byte)(bVar1 + 0xb)) && ((uint)uVar8 != uVar3)) {
      bVar2 = puVar4[uVar8];
      if ((bVar1 & 0xf0) == 0xe0) {
        if (((byte)" 000000000000\x1000"[bVar1 & 0xf] >> (bVar2 >> 5) & 1) != 0) {
          uVar9 = (long)iVar6 + 2;
          this->pos = (uint)uVar9;
          uVar8 = (ulong)uVar3;
          if ((uint)uVar9 != uVar3) {
            bVar2 = puVar4[uVar9];
            iVar5 = 3;
            uVar8 = uVar9 & 0xffffffff;
            goto joined_r0x00235fe9;
          }
        }
      }
      else if (bVar1 < 0xe0) {
        iVar5 = 2;
joined_r0x00235fe9:
        if ((char)bVar2 < -0x40) {
          this->pos = iVar6 + iVar5;
          uVar8 = (ulong)(uint)(iVar6 + iVar5);
        }
      }
      else if (((byte)""[bVar2 >> 4] >> (bVar1 & 7) & 1) != 0) {
        uVar9 = (long)iVar6 + 2;
        this->pos = (uint)uVar9;
        uVar8 = (ulong)uVar3;
        if (((uint)uVar9 != uVar3) && (uVar8 = uVar9 & 0xffffffff, (char)puVar4[uVar9] < -0x40)) {
          uVar9 = (long)iVar6 + 3;
          this->pos = (uint)uVar9;
          uVar8 = (ulong)uVar3;
          if ((uint)uVar9 != uVar3) {
            bVar2 = puVar4[uVar9];
            iVar5 = 4;
            uVar8 = uVar9 & 0xffffffff;
            goto joined_r0x00235fe9;
          }
        }
      }
    }
    num = num + -1;
    iVar6 = (int)uVar8;
  } while( true );
}

Assistant:

void
UTF8CollationIterator::forwardNumCodePoints(int32_t num, UErrorCode & /*errorCode*/) {
    U8_FWD_N(u8, pos, length, num);
}